

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redis.c
# Opt level: O1

int redis_kv_create_request(application_protocol *proto,request *req)

{
  char *pcVar1;
  long *plVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long *in_FS_OFFSET;
  double dVar9;
  
  plVar2 = (long *)proto->arg;
  lVar7 = plVar2[2];
  if (*(code **)(lVar7 + 0x14) == (code *)0x0) {
    drand48();
    dVar9 = (double)(**(code **)(lVar7 + 0xc))(lVar7);
  }
  else {
    dVar9 = (double)(**(code **)(lVar7 + 0x14))(lVar7);
  }
  lVar7 = *(long *)(*plVar2 + 0x18);
  if (lVar7 == 0) {
    __assert_fail("key != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/redis.c"
                  ,0xa1,
                  "int redis_kv_create_request(struct application_protocol *, struct request *)");
  }
  lVar8 = (long)(int)dVar9 * 0x10;
  pcVar1 = (char *)(*in_FS_OFFSET + -0xf0);
  sprintf(pcVar1,"%ld",*(undefined8 *)(lVar7 + 8 + lVar8));
  req->iovs[1].iov_base = pcVar1;
  sVar4 = strlen(pcVar1);
  req->iovs[1].iov_len = sVar4;
  req->iovs[2].iov_base = ln;
  req->iovs[2].iov_len = 2;
  req->iovs[3].iov_base = *(void **)(lVar7 + lVar8);
  req->iovs[3].iov_len = *(size_t *)(lVar7 + 8 + lVar8);
  req->iovs[4].iov_base = ln;
  req->iovs[4].iov_len = 2;
  dVar9 = drand48();
  if (dVar9 < (double)plVar2[3] || dVar9 == (double)plVar2[3]) {
    req->iovs[0].iov_base = get_prem;
    iVar3 = 5;
    uVar6 = 0xe;
    lVar7 = 0x18;
  }
  else {
    lVar7 = plVar2[1];
    if (*(code **)(lVar7 + 0x14) == (code *)0x0) {
      drand48();
      dVar9 = (double)(**(code **)(lVar7 + 0xc))(lVar7);
    }
    else {
      dVar9 = (double)(**(code **)(lVar7 + 0x14))(lVar7);
    }
    sVar5 = lround(dVar9);
    if (0x200000 < (long)sVar5) {
      __assert_fail("val_len <= MAX_VAL_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/redis.c"
                    ,0xb0,
                    "int redis_kv_create_request(struct application_protocol *, struct request *)");
    }
    req->iovs[0].iov_base = set_prem;
    req->iovs[0].iov_len = 0xe;
    req->iovs[5].iov_base = dollar;
    req->iovs[5].iov_len = 1;
    pcVar1 = (char *)(*in_FS_OFFSET + -0xb0);
    sprintf(pcVar1,"%ld",sVar5);
    req->iovs[6].iov_base = pcVar1;
    sVar4 = strlen(pcVar1);
    req->iovs[6].iov_len = sVar4;
    req->iovs[7].iov_base = ln;
    req->iovs[7].iov_len = 2;
    req->iovs[8].iov_base = random_char;
    req->iovs[8].iov_len = sVar5;
    req->iovs[9].iov_base = ln;
    iVar3 = 10;
    uVar6 = 2;
    lVar7 = 0xa8;
  }
  *(undefined8 *)((long)&((request *)(req->iovs + -1))->meta + lVar7) = uVar6;
  req->iov_cnt = iVar3;
  return 0;
}

Assistant:

static int redis_kv_create_request(struct application_protocol *proto,
						 struct request *req)
{
	struct kv_info *info;
	long val_len;
	int key_idx;
	struct iovec *key;

	info = (struct kv_info *)proto->arg;
	key_idx = generate(info->key_sel);
	key = &info->key->keys[key_idx];

	assert(key != NULL);

	// Fix key
	sprintf(key_len_str, "%ld", key->iov_len);
	req->iovs[1].iov_base = key_len_str;
	req->iovs[1].iov_len = strlen(key_len_str);
	req->iovs[2].iov_base = ln;
	req->iovs[2].iov_len = 2;
	req->iovs[3].iov_base = key->iov_base;
	req->iovs[3].iov_len = key->iov_len;
	req->iovs[4].iov_base = ln;
	req->iovs[4].iov_len = 2;

	if (drand48() > info->get_ratio) {
		val_len = lround(generate(info->val_len));
		assert(val_len <= MAX_VAL_SIZE);

		req->iovs[0].iov_base = set_prem;
		req->iovs[0].iov_len = 14;

		req->iovs[5].iov_base = dollar;
		req->iovs[5].iov_len = 1;

		// Fix val
		sprintf(val_len_str, "%ld", val_len);
		req->iovs[6].iov_base = val_len_str;
		req->iovs[6].iov_len = strlen(val_len_str);
		req->iovs[7].iov_base = ln;
		req->iovs[7].iov_len = 2;
		req->iovs[8].iov_base = random_char;
		req->iovs[8].iov_len = val_len;
		req->iovs[9].iov_base = ln;
		req->iovs[9].iov_len = 2;

		req->iov_cnt = 10;
#ifdef ENABLE_R2P2
		req->meta = (void *)(unsigned long)FIXED_ROUTE;
#endif
	} else {
		req->iovs[0].iov_base = get_prem;
		req->iovs[0].iov_len = 14;

		req->iov_cnt = 5;
#ifdef ENABLE_R2P2
		req->meta = (void *)(unsigned long)LB_ROUTE;
#endif
	}

	return 0;
}